

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O3

argument * __thiscall
argParserAdvancedConfiguration::getArgument(argParserAdvancedConfiguration *this,string *param)

{
  section *psVar1;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar2;
  argument *paVar3;
  size_t __n;
  size_t __n_00;
  int iVar4;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar5;
  pointer ppsVar6;
  pointer ppaVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar5 = this->newargconfig;
  ppsVar6 = (pvVar5->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar5->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppsVar6) {
    uVar8 = 0;
    do {
      psVar1 = ppsVar6[uVar8];
      pvVar2 = psVar1->arguments;
      ppaVar7 = (pvVar2->
                super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar7) {
        uVar9 = 0;
        do {
          paVar3 = ppaVar7[uVar9];
          iVar4 = std::__cxx11::string::compare((char *)param);
          if (iVar4 != 0) {
            __n = (paVar3->argShort)._M_string_length;
            __n_00 = param->_M_string_length;
            if (__n == __n_00) {
              if (__n == 0) {
                return paVar3;
              }
              iVar4 = bcmp((paVar3->argShort)._M_dataplus._M_p,(param->_M_dataplus)._M_p,__n);
              if (iVar4 == 0) {
                return paVar3;
              }
            }
            if ((paVar3->argLong)._M_string_length == __n_00) {
              if (__n_00 == 0) {
                return paVar3;
              }
              iVar4 = bcmp((paVar3->argLong)._M_dataplus._M_p,(param->_M_dataplus)._M_p,__n_00);
              if (iVar4 == 0) {
                return paVar3;
              }
            }
          }
          uVar9 = uVar9 + 1;
          pvVar2 = psVar1->arguments;
          ppaVar7 = (pvVar2->
                    super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(pvVar2->
                                       super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar7
                                >> 3));
        pvVar5 = this->newargconfig;
        ppsVar6 = (pvVar5->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(pvVar5->
                                   super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar6 >> 3)
            );
  }
  std::__cxx11::string::_M_assign((string *)&this->lastFailedArg);
  return (argument *)0x0;
}

Assistant:

argParserAdvancedConfiguration::argument * argParserAdvancedConfiguration::getArgument(string param){

    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++)
    {
        section * sec;
        sec = newargconfig->at(secIndex);

        for(int argIndex = 0; argIndex < sec->arguments->size();argIndex++) {
            argument * arg = sec->arguments->at(argIndex);
                if (param != "" && (arg->argShort == param || arg->argLong == param)) {
                    return arg;
                }
            }
    }
    lastFailedArg = param;
    return nullptr;
}